

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

void rw::syncObjRecurse(Frame *frame)

{
  uint8 *puVar1;
  LLLink *pLVar2;
  LLLink *pLVar3;
  
  if (frame != (Frame *)0x0) {
    do {
      pLVar3 = (frame->objectList).link.next;
      while (pLVar3 != &(frame->objectList).link) {
        pLVar2 = pLVar3->next;
        (*(code *)pLVar3[1].next)(pLVar3 + -1);
        pLVar3 = pLVar2;
      }
      puVar1 = &(frame->object).privateFlags;
      *puVar1 = *puVar1 & 0xf7;
      syncObjRecurse(frame->child);
      frame = frame->next;
    } while (frame != (Frame *)0x0);
  }
  return;
}

Assistant:

static void
syncObjRecurse(Frame *frame)
{
	for(; frame; frame = frame->next){
		// Synch attached objects
		FORLIST(lnk, frame->objectList)
			ObjectWithFrame::fromFrame(lnk)->sync();
		frame->object.privateFlags &= ~Frame::SUBTREESYNCOBJ;
		// And synch all children
		syncObjRecurse(frame->child);
	}
}